

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O2

string * LatencyDumpDefaultImpl::getActualFunction
                   (string *__return_storage_ptr__,string *str,bool add_tab)

{
  size_t sVar1;
  allocator local_50 [32];
  
  sVar1 = getNumStacks(str);
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::__cxx11::string::rfind((char *)str,0x1060fa);
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_50);
    if (add_tab && sVar1 != 1) {
      while (sVar1 = sVar1 - 1, sVar1 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getActualFunction(const std::string& str,
                                         bool add_tab = true) {
        size_t level = getNumStacks(str);
        if (!level) {
            return str;
        }

        size_t pos = str.rfind(" ## ");
        std::string ret = "";
        if (level > 1 && add_tab) {
            for (size_t i=1; i<level; ++i) {
                ret += "  ";
            }
        }
        ret += str.substr(pos + 4);
        return ret;
    }